

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

int Gia_ManHasNoEquivs(Gia_Man_t *p)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    uVar1 = 1;
  }
  else {
    uVar1 = p->nObjs;
    if ((int)uVar1 < 1) {
      uVar3 = 0;
    }
    else {
      uVar2 = 0;
      do {
        uVar3 = uVar2;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar4 = (uint)p->pReprs[uVar2] & 0xfffffff;
        if (uVar4 != 0xfffffff) {
          if (uVar1 <= uVar4) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          break;
        }
        uVar2 = uVar2 + 1;
        uVar3 = (ulong)uVar1;
      } while (uVar1 != uVar2);
    }
    uVar1 = (uint)((uint)uVar3 == uVar1);
  }
  return uVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


/**Function*************************************************************

  Synopsis    [Returns 1 if AIG has dangling nodes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManHasNoEquivs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    if ( p->pReprs == NULL )
        return 1;
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjReprObj(p, i) != NULL )
            break;
    return i == Gia_ManObjNum(p);
}